

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_staging.cc
# Opt level: O0

int __thiscall NarpcStaging::SendBytes(NarpcStaging *this,int socket,uchar *buf,int size)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  ssize_t sVar4;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  int offset;
  int remaining;
  int res;
  int local_2c;
  int local_4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"sending buf of size ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_ECX);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  sVar4 = send(in_ESI,in_RDX,(long)in_ECX,0);
  local_4 = (int)sVar4;
  poVar2 = std::operator<<((ostream *)&std::cout,"res ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  if (-1 < local_4) {
    for (local_2c = in_ECX - local_4; 0 < local_2c; local_2c = local_2c - iVar1) {
      sVar4 = send(in_ESI,(void *)((long)in_RDX + (long)(in_ECX - local_2c)),(long)local_2c,0);
      iVar1 = (int)sVar4;
      if (iVar1 < 0) {
        return iVar1;
      }
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

int NarpcStaging::SendBytes(int socket, unsigned char *buf, int size) {
  cout << "sending buf of size " << size << endl;
  int res = send(socket, buf, (size_t)size, (int)0);
  cout << "res " << res << endl;
  if (res < 0) {
    return res;
  }
  int remaining = size - res;
  while (remaining > 0) {
    int offset = size - remaining;
    res = send(socket, buf + offset, (size_t)remaining, (int)0);
    if (res < 0) {
      return res;
    }
    remaining -= res;
  }
  return remaining;
}